

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::extract_global_variables_from_functions(CompilerMSL *this)

{
  ParsedIR *this_00;
  uint id;
  ID id_00;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)2> *pTVar3;
  bool bVar4;
  uint32_t uVar5;
  StorageClass SVar6;
  SPIRVariable *pSVar7;
  SPIRFunction *pSVar8;
  long lVar9;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  processed_func_ids;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> added_arg_ids;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  global_var_ids;
  
  global_var_ids._M_h._M_buckets = &global_var_ids._M_h._M_single_bucket;
  global_var_ids._M_h._M_bucket_count = 1;
  global_var_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  global_var_ids._M_h._M_element_count = 0;
  global_var_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  global_var_ids._M_h._M_rehash_policy._M_next_resize = 0;
  global_var_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  lVar9 = 0;
  do {
    if (sVar2 << 2 == lVar9) {
      ParsedIR::LoopLock::~LoopLock((LoopLock *)&added_arg_ids);
      pSVar8 = Compiler::get<spirv_cross::SPIRFunction>
                         ((Compiler *)this,
                          (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
      pTVar3 = (pSVar8->local_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      sVar2 = (pSVar8->local_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
      for (lVar9 = 0; sVar2 << 2 != lVar9; lVar9 = lVar9 + 4) {
        pSVar7 = Compiler::get<spirv_cross::SPIRVariable>
                           ((Compiler *)this,*(uint32_t *)((long)&pTVar3->id + lVar9));
        if (pSVar7->storage != StorageClassFunction) {
          processed_func_ids._M_h._M_buckets =
               (__buckets_ptr)
               CONCAT44(processed_func_ids._M_h._M_buckets._4_4_,
                        *(undefined4 *)((long)&pTVar3->id + lVar9));
          ::std::__detail::
          _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)&global_var_ids,(value_type *)&processed_func_ids);
        }
      }
      added_arg_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &added_arg_ids._M_t._M_impl.super__Rb_tree_header._M_header;
      added_arg_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      added_arg_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      added_arg_ids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      processed_func_ids._M_h._M_buckets = &processed_func_ids._M_h._M_single_bucket;
      processed_func_ids._M_h._M_bucket_count = 1;
      processed_func_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processed_func_ids._M_h._M_element_count = 0;
      processed_func_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      processed_func_ids._M_h._M_rehash_policy._M_next_resize = 0;
      processed_func_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
      added_arg_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           added_arg_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      extract_global_variables_from_function
                (this,(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id,
                 &added_arg_ids,&global_var_ids,&processed_func_ids);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&processed_func_ids._M_h);
      ::std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&added_arg_ids._M_t);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&global_var_ids._M_h);
      return;
    }
    id = *(uint *)((long)&pTVar1->id + lVar9);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeVariable) {
      pSVar7 = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,id);
      SVar6 = pSVar7->storage;
      if (SVar6 == StorageClassInput) {
        bVar4 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar7->super_IVariant).self.id,DecorationBuiltIn);
        if (bVar4) {
          uVar5 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(pSVar7->super_IVariant).self.id,DecorationBuiltIn
                            );
          if (uVar5 == 0x17) {
            if (((this->msl_options).manual_helper_invocation_updates != true) ||
               ((this->msl_options).msl_version < 0x4f4c)) goto LAB_001cb1b4;
            id_00.id = (pSVar7->super_IVariant).self.id;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      ((string *)&processed_func_ids,this,0x17,1);
            Compiler::set_name((Compiler *)this,id_00,(string *)&processed_func_ids);
            ::std::__cxx11::string::~string((string *)&processed_func_ids);
            pSVar8 = Compiler::get<spirv_cross::SPIRFunction>
                               ((Compiler *)this,
                                (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id)
            ;
            SPIRFunction::add_local_variable(pSVar8,(VariableID)(pSVar7->super_IVariant).self.id);
            processed_func_ids._M_h._M_buckets =
                 (__buckets_ptr)
                 CONCAT44(processed_func_ids._M_h._M_buckets._4_4_,(pSVar7->super_IVariant).self.id)
            ;
            SmallVector<unsigned_int,_8UL>::push_back
                      (&this->vars_needing_early_declaration,(uint *)&processed_func_ids);
            processed_func_ids._M_h._M_element_count =
                 (size_type)
                 ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp:1903:41)>
                 ::_M_invoke;
            processed_func_ids._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)
                 ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp:1903:41)>
                 ::_M_manager;
            processed_func_ids._M_h._M_buckets = (__buckets_ptr)this;
            processed_func_ids._M_h._M_bucket_count = (size_type)pSVar7;
            SmallVector<std::function<void_()>,_0UL>::push_back
                      (&pSVar8->fixup_hooks_in,(function<void_()> *)&processed_func_ids);
            ::std::_Function_base::~_Function_base((_Function_base *)&processed_func_ids);
          }
        }
        SVar6 = pSVar7->storage;
      }
      if ((SVar6 < (StorageClassStorageBuffer|StorageClassInput)) &&
         ((0x120fU >> (SVar6 & 0x1f) & 1) != 0)) {
        processed_func_ids._M_h._M_buckets =
             (__buckets_ptr)
             CONCAT44(processed_func_ids._M_h._M_buckets._4_4_,(pSVar7->super_IVariant).self.id);
        ::std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)&global_var_ids,(value_type *)&processed_func_ids);
      }
    }
LAB_001cb1b4:
    lVar9 = lVar9 + 4;
  } while( true );
}

Assistant:

void CompilerMSL::extract_global_variables_from_functions()
{
	// Uniforms
	unordered_set<uint32_t> global_var_ids;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		// Some builtins resolve directly to a function call which does not need any declared variables.
		// Skip these.
		if (var.storage == StorageClassInput && has_decoration(var.self, DecorationBuiltIn))
		{
			auto bi_type = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
			if (bi_type == BuiltInHelperInvocation && !needs_manual_helper_invocation_updates())
				return;
			if (bi_type == BuiltInHelperInvocation && needs_manual_helper_invocation_updates())
			{
				if (msl_options.is_ios() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("simd_is_helper_thread() requires version 2.3 on iOS.");
				else if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("simd_is_helper_thread() requires version 2.1 on macOS.");
				// Make sure this is declared and initialized.
				// Force this to have the proper name.
				set_name(var.self, builtin_to_glsl(BuiltInHelperInvocation, StorageClassInput));
				auto &entry_func = this->get<SPIRFunction>(ir.default_entry_point);
				entry_func.add_local_variable(var.self);
				vars_needing_early_declaration.push_back(var.self);
				entry_func.fixup_hooks_in.push_back([this, &var]()
				                                    { statement(to_name(var.self), " = simd_is_helper_thread();"); });
			}
		}

		if (var.storage == StorageClassInput || var.storage == StorageClassOutput ||
		    var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		    var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer)
		{
			global_var_ids.insert(var.self);
		}
	});

	// Local vars that are declared in the main function and accessed directly by a function
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	for (auto &var : entry_func.local_variables)
		if (get<SPIRVariable>(var).storage != StorageClassFunction)
			global_var_ids.insert(var);

	std::set<uint32_t> added_arg_ids;
	unordered_set<uint32_t> processed_func_ids;
	extract_global_variables_from_function(ir.default_entry_point, added_arg_ids, global_var_ids, processed_func_ids);
}